

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

int cmcmd_cmake_ninja_dyndep(const_iterator argBeg,const_iterator argEnd)

{
  pointer *ppuVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  cmFileSetVisibility cVar8;
  Value *pVVar9;
  Value *pVVar10;
  mapped_type *this;
  Value *pVVar11;
  pointer puVar12;
  uint uVar13;
  pointer __x;
  pointer puVar14;
  _Base_ptr p_Var15;
  string *this_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> __str_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  const_iterator cVar16;
  string_view name;
  undefined1 local_bb0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ba0;
  undefined1 local_b90 [16];
  string dir_top_bld;
  string dir_cur_src;
  string arg_tdi;
  Value tdio;
  string arg_lang;
  string arg_dd;
  string module_dir;
  string arg_modmapfmt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked_target_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_ddis;
  string dir_top_src;
  CxxModuleExportInfo export_info;
  string dir_cur_bld;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_full;
  cmake cm;
  
  cmSystemTools::HandleResponseFile(&arg_full,argBeg,argEnd);
  arg_dd._M_dataplus._M_p = (pointer)&arg_dd.field_2;
  arg_dd._M_string_length = 0;
  arg_dd.field_2._M_local_buf[0] = '\0';
  arg_lang._M_dataplus._M_p = (pointer)&arg_lang.field_2;
  arg_lang._M_string_length = 0;
  arg_lang.field_2._M_local_buf[0] = '\0';
  arg_tdi._M_dataplus._M_p = (pointer)&arg_tdi.field_2;
  arg_tdi._M_string_length = 0;
  arg_tdi.field_2._M_local_buf[0] = '\0';
  arg_modmapfmt._M_dataplus._M_p = (pointer)&arg_modmapfmt.field_2;
  arg_modmapfmt._M_string_length = 0;
  arg_modmapfmt.field_2._M_local_buf[0] = '\0';
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (arg_full.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      arg_full.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002fb82b:
    ppuVar1 = &cm.Generators.
               super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    cm.Generators.
    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cm,"-E cmake_ninja_dyndep requires value for --tdi=","");
    cmSystemTools::Error((string *)&cm);
    p_Var15 = (_Base_ptr)
              cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar12 = cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppuVar1) {
LAB_002fb967:
      operator_delete(puVar12,(ulong)((long)&p_Var15->_M_color + 1));
    }
  }
  else {
    __x = arg_full.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cm.Generators.
      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__x->_M_dataplus)._M_p;
      cm.Generators.
      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)__x->_M_string_length;
      __str._M_str = "--tdi=";
      __str._M_len = 6;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&cm,0,6,__str);
      if (iVar7 == 0) {
        std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
        this_00 = &arg_tdi;
LAB_002fb520:
        std::__cxx11::string::operator=((string *)this_00,(string *)&cm);
        if (cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&cm.Generators.
                      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(cm.Generators.
                          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((cm.Generators.
                                           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t
                                         ).
                                         super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                         .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                         _M_head_impl + 1));
        }
      }
      else {
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__x->_M_dataplus)._M_p;
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__x->_M_string_length;
        __str_00._M_str = "--lang=";
        __str_00._M_len = 7;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&cm,0,7,__str_00);
        if (iVar7 == 0) {
          std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
          this_00 = &arg_lang;
          goto LAB_002fb520;
        }
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__x->_M_dataplus)._M_p;
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__x->_M_string_length;
        __str_01._M_str = "--dd=";
        __str_01._M_len = 5;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&cm,0,5,__str_01);
        if (iVar7 == 0) {
          std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
          this_00 = &arg_dd;
          goto LAB_002fb520;
        }
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__x->_M_dataplus)._M_p;
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__x->_M_string_length;
        __str_02._M_str = "--modmapfmt=";
        __str_02._M_len = 0xc;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&cm,0,0xc,__str_02);
        if (iVar7 == 0) {
          std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
          this_00 = &arg_modmapfmt;
          goto LAB_002fb520;
        }
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__x->_M_dataplus)._M_p;
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__x->_M_string_length;
        __str_03._M_str = "--";
        __str_03._M_len = 2;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&cm,0,2,__str_03);
        if (iVar7 == 0) {
LAB_002fb875:
          puVar12 = (pointer)(__x->_M_dataplus)._M_p;
          puVar14 = (pointer)__x->_M_string_length;
LAB_002fb87c:
          cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000028;
          cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_ea200e;
          views._M_len = 2;
          views._M_array = (iterator)&cm;
          cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar14;
          cm.ExtraGenerators.
          super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar12;
          cmCatViews_abi_cxx11_((string *)&export_info,views);
          cmSystemTools::Error((string *)&export_info);
          p_Var15 = export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          puVar12 = (pointer)export_info.ObjectToFileSet._M_t._M_impl._0_8_;
          if ((_Base_ptr *)export_info.ObjectToFileSet._M_t._M_impl._0_8_ !=
              &export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
          goto LAB_002fb967;
          goto LAB_002fb96f;
        }
        puVar12 = (pointer)(__x->_M_dataplus)._M_p;
        puVar14 = (pointer)__x->_M_string_length;
        if (puVar14 < (pointer)0x4) goto LAB_002fb87c;
        __str_04._M_str = ".ddi";
        __str_04._M_len = 4;
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = puVar14;
        cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar12;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&cm,
                           (size_type)
                           ((long)&puVar14[-1]._M_t.
                                   super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                   .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                   _M_head_impl + 4),4,__str_04);
        if (iVar7 != 0) goto LAB_002fb875;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&arg_ddis,__x);
      }
      __x = __x + 1;
    } while (__x != arg_full.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    if (arg_tdi._M_string_length == 0) goto LAB_002fb82b;
    if (arg_lang._M_string_length == 0) {
      cm.Generators.
      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&cm.Generators.
                     super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cm,"-E cmake_ninja_dyndep requires value for --lang=","");
      cmSystemTools::Error((string *)&cm);
    }
    else {
      if (arg_dd._M_string_length != 0) {
        Json::Value::Value(&tdio,nullValue);
        std::ifstream::ifstream(&cm,arg_tdi._M_dataplus._M_p,_S_in|_S_bin);
        Json::Reader::Reader((Reader *)&export_info);
        bVar6 = Json::Reader::parse((Reader *)&export_info,(istream *)&cm,&tdio,false);
        sVar5 = arg_tdi._M_string_length;
        _Var4 = arg_tdi._M_dataplus;
        if (bVar6) {
          if (export_info.Exports.
              super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)&export_info.Config) {
            operator_delete(export_info.Exports.
                            super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                            (ulong)(export_info.Config._M_dataplus._M_p + 1));
          }
          if ((undefined1 *)
              export_info.BmiInstallation.super__Optional_base<CxxModuleBmiInstall,_false,_false>.
              _M_payload.super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
              super__Optional_payload_base<CxxModuleBmiInstall>._M_payload._M_value.MessageLevel.
              _M_string_length !=
              (undefined1 *)
              ((long)&export_info.BmiInstallation.
                      super__Optional_base<CxxModuleBmiInstall,_false,_false>._M_payload.
                      super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
                      super__Optional_payload_base<CxxModuleBmiInstall>._M_payload + 0x80U)) {
            operator_delete((void *)export_info.BmiInstallation.
                                    super__Optional_base<CxxModuleBmiInstall,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>
                                    .super__Optional_payload_base<CxxModuleBmiInstall>._M_payload.
                                    _M_value.MessageLevel._M_string_length,
                            export_info.BmiInstallation.
                            super__Optional_base<CxxModuleBmiInstall,_false,_false>._M_payload.
                            super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
                            super__Optional_payload_base<CxxModuleBmiInstall>._M_payload._128_8_ + 1
                           );
          }
          std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                    ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                     ((long)&export_info.BmiInstallation.
                             super__Optional_base<CxxModuleBmiInstall,_false,_false>._M_payload.
                             super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
                             super__Optional_payload_base<CxxModuleBmiInstall>._M_payload + 0x20));
          std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                    ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&export_info);
          std::ifstream::~ifstream(&cm);
          pVVar9 = Json::Value::operator[](&tdio,"dir-cur-bld");
          Json::Value::asString_abi_cxx11_(&dir_cur_bld,pVVar9);
          pVVar9 = Json::Value::operator[](&tdio,"dir-cur-src");
          Json::Value::asString_abi_cxx11_(&dir_cur_src,pVVar9);
          pVVar9 = Json::Value::operator[](&tdio,"dir-top-bld");
          Json::Value::asString_abi_cxx11_(&dir_top_bld,pVVar9);
          pVVar9 = Json::Value::operator[](&tdio,"dir-top-src");
          Json::Value::asString_abi_cxx11_(&dir_top_src,pVVar9);
          pVVar9 = Json::Value::operator[](&tdio,"module-dir");
          Json::Value::asString_abi_cxx11_(&module_dir,pVVar9);
          if (module_dir._M_string_length != 0) {
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)module_dir._M_string_length;
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)module_dir._M_dataplus._M_p;
            __str_05._M_str = "/";
            __str_05._M_len = 1;
            iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&cm,
                               module_dir._M_string_length - 1,1,__str_05);
            if (iVar7 != 0) {
              std::__cxx11::string::push_back((char)&module_dir);
            }
          }
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pVVar9 = Json::Value::operator[](&tdio,"linked-target-dirs");
          bVar6 = Json::Value::isArray(pVVar9);
          if (bVar6) {
            cVar16 = Json::Value::begin(pVVar9);
            export_info.ObjectToFileSet._M_t._M_impl._0_8_ =
                 cVar16.super_ValueIteratorBase.current_._M_node;
            export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 CONCAT31(export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_color._1_3_,cVar16.super_ValueIteratorBase.isNull_);
            cVar16 = Json::Value::end(pVVar9);
            local_bb0._0_8_ = cVar16.super_ValueIteratorBase.current_._M_node;
            local_bb0[8] = cVar16.super_ValueIteratorBase.isNull_;
            while (bVar6 = Json::ValueIteratorBase::isEqual
                                     ((ValueIteratorBase *)&export_info,(SelfType *)local_bb0),
                  !bVar6) {
              pVVar9 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&export_info);
              Json::Value::asString_abi_cxx11_((String *)&cm,pVVar9);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &linked_target_dirs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm);
              if (cm.Generators.
                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((cm.Generators.
                                                 super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_t).
                                               super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               .
                                               super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                               ._M_head_impl + 1));
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)&export_info);
            }
          }
          export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header;
          export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          export_info.BmiInstallation.super__Optional_base<CxxModuleBmiInstall,_false,_false>.
          _M_payload.super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
          super__Optional_payload_base<CxxModuleBmiInstall>._M_engaged = false;
          export_info.Exports.super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          export_info.Exports.super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          export_info.Exports.super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          export_info.Config._M_dataplus._M_p = (pointer)&export_info.Config.field_2;
          export_info.Config._M_string_length = 0;
          export_info.Config.field_2._M_local_buf[0] = '\0';
          export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pVVar9 = Json::Value::operator[](&tdio,"config");
          Json::Value::asString_abi_cxx11_((String *)&cm,pVVar9);
          std::__cxx11::string::operator=((string *)&export_info.Config,(string *)&cm);
          if (cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&cm.Generators.
                        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(cm.Generators.
                            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((cm.Generators.
                                             super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_t).
                                           super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                           .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                           ._M_head_impl + 1));
          }
          if (export_info.Config._M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)&export_info.Config,0,(char *)0x0,0x6bc97b);
          }
          pVVar9 = Json::Value::operator[](&tdio,"exports");
          bVar6 = Json::Value::isArray(pVVar9);
          if (bVar6) {
            cVar16 = Json::Value::begin(pVVar9);
            local_b90._0_8_ = cVar16.super_ValueIteratorBase.current_._M_node;
            local_b90[8] = cVar16.super_ValueIteratorBase.isNull_;
            cVar16 = Json::Value::end(pVVar9);
            local_8d0._M_allocated_capacity =
                 (size_type)cVar16.super_ValueIteratorBase.current_._M_node;
            local_8d0._M_local_buf[8] = cVar16.super_ValueIteratorBase.isNull_;
            while (bVar6 = Json::ValueIteratorBase::isEqual
                                     ((ValueIteratorBase *)local_b90,(SelfType *)&local_8d0), !bVar6
                  ) {
              pVVar9 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_b90);
              cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&cm.Generators.
                             super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)cm.Generators.
                                    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              cm.ExtraGenerators.
              super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&cm.DiagLevels;
              cm.ExtraGenerators.
              super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cm.DiagLevels._M_t._M_impl._0_1_ = 0;
              cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)&cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
              cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)
                   ((ulong)cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right &
                   0xffffffffffffff00);
              cm.GeneratorInstance._M_dataplus._M_p = (pointer)&cm.GeneratorInstance.field_2;
              cm.GeneratorInstance._M_string_length = 0;
              cm.GeneratorInstance.field_2._M_allocated_capacity =
                   cm.GeneratorInstance.field_2._M_allocated_capacity & 0xffffffffffffff00;
              cm.GeneratorPlatform._M_dataplus._M_p = (pointer)&cm.GeneratorPlatform.field_2;
              cm.GeneratorPlatform._M_string_length = 0;
              cm.GeneratorPlatform.field_2._M_allocated_capacity =
                   cm.GeneratorPlatform.field_2._M_allocated_capacity & 0xffffffffffffff00;
              pVVar10 = Json::Value::operator[](pVVar9,"install");
              cm.GeneratorToolset._M_dataplus._M_p._0_1_ = Json::Value::asBool(pVVar10);
              pVVar10 = Json::Value::operator[](pVVar9,"export-name");
              Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar10);
              std::__cxx11::string::operator=((string *)&cm,(string *)local_bb0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bb0._0_8_ != &local_ba0) {
                operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
              }
              pVVar10 = Json::Value::operator[](pVVar9,"destination");
              Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar10);
              std::__cxx11::string::operator=
                        ((string *)
                         &cm.ExtraGenerators.
                          super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(string *)local_bb0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bb0._0_8_ != &local_ba0) {
                operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
              }
              pVVar10 = Json::Value::operator[](pVVar9,"export-prefix");
              Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar10);
              std::__cxx11::string::operator=
                        ((string *)
                         &cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                         (string *)local_bb0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bb0._0_8_ != &local_ba0) {
                operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
              }
              pVVar10 = Json::Value::operator[](pVVar9,"cxx-module-info-dir");
              Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar10);
              std::__cxx11::string::operator=((string *)&cm.GeneratorInstance,(string *)local_bb0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bb0._0_8_ != &local_ba0) {
                operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
              }
              pVVar9 = Json::Value::operator[](pVVar9,"namespace");
              Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar9);
              std::__cxx11::string::operator=((string *)&cm.GeneratorPlatform,(string *)local_bb0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bb0._0_8_ != &local_ba0) {
                operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
              }
              std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::push_back
                        (&export_info.Exports,(value_type *)&cm);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)cm.GeneratorPlatform._M_dataplus._M_p != &cm.GeneratorPlatform.field_2) {
                operator_delete(cm.GeneratorPlatform._M_dataplus._M_p,
                                cm.GeneratorPlatform.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)cm.GeneratorInstance._M_dataplus._M_p != &cm.GeneratorInstance.field_2) {
                operator_delete(cm.GeneratorInstance._M_dataplus._M_p,
                                cm.GeneratorInstance.field_2._M_allocated_capacity + 1);
              }
              if (cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                  (_Base_ptr)&cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
                operator_delete(cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                ,(ulong)((long)&(cm.DiagLevels._M_t._M_impl.super__Rb_tree_header.
                                                 _M_header._M_right)->_M_color + 1));
              }
              if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                   *)cm.ExtraGenerators.
                     super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &cm.DiagLevels) {
                operator_delete(cm.ExtraGenerators.
                                super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                CONCAT71(cm.DiagLevels._M_t._M_impl._1_7_,
                                         cm.DiagLevels._M_t._M_impl._0_1_) + 1);
              }
              if (cm.Generators.
                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((cm.Generators.
                                                 super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_t).
                                               super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               .
                                               super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                               ._M_head_impl + 1));
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_b90);
            }
          }
          pVVar9 = Json::Value::operator[](&tdio,"bmi-installation");
          bVar6 = Json::Value::isObject(pVVar9);
          if (bVar6) {
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&cm.Generators.
                           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cm.Generators.
            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)cm.Generators.
                                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffffffffff00);
            cm.ExtraGenerators.
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cm.DiagLevels._M_t._M_impl._0_1_ = 0;
            cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)&cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_node_count;
            cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
            puVar2 = (undefined1 *)((long)&cm.GeneratorInstance.field_2 + 8);
            cm.GeneratorInstance.field_2._M_allocated_capacity = 0;
            cm.GeneratorInstance.field_2._M_local_buf[8] = '\0';
            puVar3 = (undefined1 *)((long)&cm.GeneratorPlatform.field_2 + 8);
            cm.GeneratorPlatform.field_2._M_allocated_capacity = 0;
            cm.GeneratorPlatform.field_2._M_local_buf[8] = '\0';
            cm.ExtraGenerators.
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)&cm.DiagLevels;
            cm.GeneratorInstance._M_string_length = (size_type)puVar2;
            cm.GeneratorPlatform._M_string_length = (size_type)puVar3;
            pVVar10 = Json::Value::operator[](pVVar9,"component");
            Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar10);
            std::__cxx11::string::operator=((string *)&cm,(string *)local_bb0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bb0._0_8_ != &local_ba0) {
              operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
            }
            pVVar10 = Json::Value::operator[](pVVar9,"destination");
            Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar10);
            std::__cxx11::string::operator=
                      ((string *)
                       &cm.ExtraGenerators.
                        super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(string *)local_bb0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bb0._0_8_ != &local_ba0) {
              operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
            }
            pVVar10 = Json::Value::operator[](pVVar9,"exclude-from-all");
            bVar6 = Json::Value::asBool(pVVar10);
            cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)
                 CONCAT71(cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_
                          ,bVar6);
            pVVar10 = Json::Value::operator[](pVVar9,"optional");
            bVar6 = Json::Value::asBool(pVVar10);
            cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_2_ =
                 CONCAT11(bVar6,cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                ._0_1_);
            pVVar10 = Json::Value::operator[](pVVar9,"permissions");
            Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar10);
            std::__cxx11::string::operator=
                      ((string *)&cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                       ,(string *)local_bb0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bb0._0_8_ != &local_ba0) {
              operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
            }
            pVVar10 = Json::Value::operator[](pVVar9,"message-level");
            Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar10);
            std::__cxx11::string::operator=
                      ((string *)&cm.GeneratorInstance._M_string_length,(string *)local_bb0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bb0._0_8_ != &local_ba0) {
              operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
            }
            pVVar9 = Json::Value::operator[](pVVar9,"script-location");
            Json::Value::asString_abi_cxx11_((String *)local_bb0,pVVar9);
            std::__cxx11::string::operator=
                      ((string *)&cm.GeneratorPlatform._M_string_length,(string *)local_bb0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bb0._0_8_ != &local_ba0) {
              operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
            }
            std::optional<CxxModuleBmiInstall>::operator=
                      (&export_info.BmiInstallation,(CxxModuleBmiInstall *)&cm);
            if ((undefined1 *)cm.GeneratorPlatform._M_string_length != puVar3) {
              operator_delete((void *)cm.GeneratorPlatform._M_string_length,
                              CONCAT71(cm.GeneratorPlatform.field_2._9_7_,
                                       cm.GeneratorPlatform.field_2._M_local_buf[8]) + 1);
            }
            if ((undefined1 *)cm.GeneratorInstance._M_string_length != puVar2) {
              operator_delete((void *)cm.GeneratorInstance._M_string_length,
                              CONCAT71(cm.GeneratorInstance.field_2._9_7_,
                                       cm.GeneratorInstance.field_2._M_local_buf[8]) + 1);
            }
            if (cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                (_Base_ptr)&cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              operator_delete(cm.DiagLevels._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                              CONCAT71(cm.DiagLevels._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count._1_7_,
                                       (undefined1)
                                       cm.DiagLevels._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count) + 1);
            }
            if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                 *)cm.ExtraGenerators.
                   super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish != &cm.DiagLevels) {
              operator_delete(cm.ExtraGenerators.
                              super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              CONCAT71(cm.DiagLevels._M_t._M_impl._1_7_,
                                       cm.DiagLevels._M_t._M_impl._0_1_) + 1);
            }
            if (cm.Generators.
                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&cm.Generators.
                          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(cm.Generators.
                              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&((cm.Generators.
                                               super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             _M_t).
                                             super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                             .
                                             super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                             ._M_head_impl + 1));
            }
          }
          pVVar9 = Json::Value::operator[](&tdio,"cxx-modules");
          bVar6 = Json::Value::isObject(pVVar9);
          if (bVar6) {
            cVar16 = Json::Value::begin(pVVar9);
            local_b90._0_8_ = cVar16.super_ValueIteratorBase.current_._M_node;
            local_b90[8] = cVar16.super_ValueIteratorBase.isNull_;
            while( true ) {
              cVar16 = Json::Value::end(pVVar9);
              cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)cVar16.super_ValueIteratorBase.current_._M_node;
              cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)CONCAT71(cm.Generators.
                                     super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                     cVar16.super_ValueIteratorBase.isNull_);
              bVar6 = Json::ValueIteratorBase::isEqual
                                ((ValueIteratorBase *)local_b90,(SelfType *)&cm);
              if (bVar6) break;
              Json::ValueIteratorBase::key((Value *)&cm,(ValueIteratorBase *)local_b90);
              Json::Value::asString_abi_cxx11_((String *)local_bb0,(Value *)&cm);
              this = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                     ::operator[](&export_info.ObjectToFileSet,(String *)local_bb0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bb0._0_8_ != &local_ba0) {
                operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
              }
              Json::Value::~Value((Value *)&cm);
              pVVar10 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_b90);
              pVVar11 = Json::Value::operator[](pVVar10,"name");
              Json::Value::asString_abi_cxx11_((String *)&cm,pVVar11);
              std::__cxx11::string::operator=((string *)this,(string *)&cm);
              if (cm.Generators.
                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((cm.Generators.
                                                 super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_t).
                                               super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               .
                                               super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                               ._M_head_impl + 1));
              }
              pVVar11 = Json::Value::operator[](pVVar10,"relative-directory");
              Json::Value::asString_abi_cxx11_((String *)&cm,pVVar11);
              std::__cxx11::string::operator=((string *)&this->RelativeDirectory,(string *)&cm);
              if (cm.Generators.
                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((cm.Generators.
                                                 super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_t).
                                               super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               .
                                               super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                               ._M_head_impl + 1));
              }
              pVVar11 = Json::Value::operator[](pVVar10,"source");
              Json::Value::asString_abi_cxx11_((String *)&cm,pVVar11);
              std::__cxx11::string::operator=((string *)&this->SourcePath,(string *)&cm);
              if (cm.Generators.
                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((cm.Generators.
                                                 super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_t).
                                               super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               .
                                               super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                               ._M_head_impl + 1));
              }
              pVVar11 = Json::Value::operator[](pVVar10,"type");
              Json::Value::asString_abi_cxx11_((String *)&cm,pVVar11);
              std::__cxx11::string::operator=((string *)&this->Type,(string *)&cm);
              if (cm.Generators.
                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((cm.Generators.
                                                 super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_t).
                                               super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               .
                                               super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                               ._M_head_impl + 1));
              }
              pVVar11 = Json::Value::operator[](pVVar10,"visibility");
              Json::Value::asString_abi_cxx11_((String *)&cm,pVVar11);
              name._M_str = (char *)cm.Generators.
                                    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
              name._M_len = (size_t)cm.Generators.
                                    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
              cVar8 = cmFileSetVisibilityFromName(name,(cmMakefile *)0x0);
              this->Visibility = cVar8;
              if (cm.Generators.
                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((cm.Generators.
                                                 super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_t).
                                               super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                               .
                                               super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                               ._M_head_impl + 1));
              }
              pVVar10 = Json::Value::operator[](pVVar10,"destination");
              bVar6 = Json::Value::isString(pVVar10);
              if (bVar6) {
                Json::Value::asString_abi_cxx11_((String *)&cm,pVVar10);
                std::optional<std::__cxx11::string>::operator=
                          ((optional<std::__cxx11::string> *)&this->Destination,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm)
                ;
                if (cm.Generators.
                    super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (pointer)&cm.Generators.
                              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  operator_delete(cm.Generators.
                                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (ulong)((long)&((cm.Generators.
                                                                                                      
                                                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_t).
                                                 super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                                 .
                                                 super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>
                                                 ._M_head_impl + 1));
                }
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_b90);
            }
          }
          cmake::cmake(&cm,RoleInternal,Unknown,Normal);
          cmake::SetHomeDirectory(&cm,&dir_top_src);
          cmake::SetHomeOutputDirectory(&cm,&dir_top_bld);
          local_bb0._0_8_ = &local_ba0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_bb0,"Ninja","");
          cmake::CreateGlobalGenerator((cmake *)local_b90,(string *)&cm,SUB81(local_bb0,0));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_bb0._0_8_ != &local_ba0) {
            operator_delete((void *)local_bb0._0_8_,local_ba0._M_allocated_capacity + 1);
          }
          if ((cmGlobalNinjaGenerator *)local_b90._0_8_ == (cmGlobalNinjaGenerator *)0x0) {
            bVar6 = true;
          }
          else {
            bVar6 = cmGlobalNinjaGenerator::WriteDyndepFile
                              ((cmGlobalNinjaGenerator *)local_b90._0_8_,&dir_top_src,&dir_top_bld,
                               &dir_cur_src,&dir_cur_bld,&arg_dd,&arg_ddis,&module_dir,
                               &linked_target_dirs,&arg_lang,&arg_modmapfmt,&export_info);
            bVar6 = !bVar6;
            if ((cmGlobalNinjaGenerator *)local_b90._0_8_ != (cmGlobalNinjaGenerator *)0x0) {
              (**(code **)(*(long *)local_b90._0_8_ + 8))();
            }
          }
          cmake::~cmake(&cm);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)export_info.Config._M_dataplus._M_p != &export_info.Config.field_2) {
            operator_delete(export_info.Config._M_dataplus._M_p,
                            CONCAT71(export_info.Config.field_2._M_allocated_capacity._1_7_,
                                     export_info.Config.field_2._M_local_buf[0]) + 1);
          }
          std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::~vector
                    (&export_info.Exports);
          if (export_info.BmiInstallation.super__Optional_base<CxxModuleBmiInstall,_false,_false>.
              _M_payload.super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
              super__Optional_payload_base<CxxModuleBmiInstall>._M_engaged == true) {
            std::_Optional_payload_base<CxxModuleBmiInstall>::_M_destroy
                      ((_Optional_payload_base<CxxModuleBmiInstall> *)&export_info.BmiInstallation);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                       *)&export_info);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&linked_target_dirs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)module_dir._M_dataplus._M_p != &module_dir.field_2) {
            operator_delete(module_dir._M_dataplus._M_p,module_dir.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_src._M_dataplus._M_p != &dir_top_src.field_2) {
            operator_delete(dir_top_src._M_dataplus._M_p,
                            dir_top_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_bld._M_dataplus._M_p != &dir_top_bld.field_2) {
            operator_delete(dir_top_bld._M_dataplus._M_p,
                            dir_top_bld.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_src._M_dataplus._M_p != &dir_cur_src.field_2) {
            operator_delete(dir_cur_src._M_dataplus._M_p,
                            dir_cur_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_bld._M_dataplus._M_p != &dir_cur_bld.field_2) {
            operator_delete(dir_cur_bld._M_dataplus._M_p,
                            dir_cur_bld.field_2._M_allocated_capacity + 1);
          }
          uVar13 = (uint)bVar6;
        }
        else {
          Json::Reader::getFormattedErrorMessages_abi_cxx11_(&dir_top_bld,(Reader *)&export_info);
          dir_cur_bld._M_dataplus._M_p = (pointer)0x26;
          dir_cur_bld._M_string_length = (size_type)anon_var_dwarf_ea1cd4;
          dir_cur_bld.field_2._M_allocated_capacity = sVar5;
          dir_cur_bld.field_2._8_8_ = _Var4._M_p;
          views_00._M_len = 3;
          views_00._M_array = (iterator)&dir_cur_bld;
          cmCatViews_abi_cxx11_(&dir_cur_src,views_00);
          cmSystemTools::Error(&dir_cur_src);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_src._M_dataplus._M_p != &dir_cur_src.field_2) {
            operator_delete(dir_cur_src._M_dataplus._M_p,
                            dir_cur_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_bld._M_dataplus._M_p != &dir_top_bld.field_2) {
            operator_delete(dir_top_bld._M_dataplus._M_p,
                            dir_top_bld.field_2._M_allocated_capacity + 1);
          }
          if (export_info.Exports.
              super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)&export_info.Config) {
            operator_delete(export_info.Exports.
                            super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                            (ulong)(export_info.Config._M_dataplus._M_p + 1));
          }
          if ((undefined1 *)
              export_info.BmiInstallation.super__Optional_base<CxxModuleBmiInstall,_false,_false>.
              _M_payload.super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
              super__Optional_payload_base<CxxModuleBmiInstall>._M_payload._M_value.MessageLevel.
              _M_string_length !=
              (undefined1 *)
              ((long)&export_info.BmiInstallation.
                      super__Optional_base<CxxModuleBmiInstall,_false,_false>._M_payload.
                      super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
                      super__Optional_payload_base<CxxModuleBmiInstall>._M_payload + 0x80U)) {
            operator_delete((void *)export_info.BmiInstallation.
                                    super__Optional_base<CxxModuleBmiInstall,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>
                                    .super__Optional_payload_base<CxxModuleBmiInstall>._M_payload.
                                    _M_value.MessageLevel._M_string_length,
                            export_info.BmiInstallation.
                            super__Optional_base<CxxModuleBmiInstall,_false,_false>._M_payload.
                            super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
                            super__Optional_payload_base<CxxModuleBmiInstall>._M_payload._128_8_ + 1
                           );
          }
          std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                    ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                     ((long)&export_info.BmiInstallation.
                             super__Optional_base<CxxModuleBmiInstall,_false,_false>._M_payload.
                             super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
                             super__Optional_payload_base<CxxModuleBmiInstall>._M_payload + 0x20));
          std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                    ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&export_info);
          std::ifstream::~ifstream(&cm);
          uVar13 = 1;
        }
        Json::Value::~Value(&tdio);
        goto LAB_002fb974;
      }
      cm.Generators.
      super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&cm.Generators.
                     super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cm,"-E cmake_ninja_dyndep requires value for --dd=","");
      cmSystemTools::Error((string *)&cm);
    }
    p_Var15 = (_Base_ptr)
              cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar12 = cm.Generators.
              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (cm.Generators.
        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&cm.Generators.
                  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_002fb967;
  }
LAB_002fb96f:
  uVar13 = 1;
LAB_002fb974:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_ddis);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_modmapfmt._M_dataplus._M_p != &arg_modmapfmt.field_2) {
    operator_delete(arg_modmapfmt._M_dataplus._M_p,
                    CONCAT71(arg_modmapfmt.field_2._M_allocated_capacity._1_7_,
                             arg_modmapfmt.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_tdi._M_dataplus._M_p != &arg_tdi.field_2) {
    operator_delete(arg_tdi._M_dataplus._M_p,
                    CONCAT71(arg_tdi.field_2._M_allocated_capacity._1_7_,
                             arg_tdi.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_lang._M_dataplus._M_p != &arg_lang.field_2) {
    operator_delete(arg_lang._M_dataplus._M_p,
                    CONCAT71(arg_lang.field_2._M_allocated_capacity._1_7_,
                             arg_lang.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_dd._M_dataplus._M_p != &arg_dd.field_2) {
    operator_delete(arg_dd._M_dataplus._M_p,
                    CONCAT71(arg_dd.field_2._M_allocated_capacity._1_7_,
                             arg_dd.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_full);
  return uVar13;
}

Assistant:

int cmcmd_cmake_ninja_dyndep(std::vector<std::string>::const_iterator argBeg,
                             std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full =
    cmSystemTools::HandleResponseFile(argBeg, argEnd);

  std::string arg_dd;
  std::string arg_lang;
  std::string arg_tdi;
  std::string arg_modmapfmt;
  std::vector<std::string> arg_ddis;
  for (std::string const& arg : arg_full) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else if (cmHasLiteralPrefix(arg, "--dd=")) {
      arg_dd = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--modmapfmt=")) {
      arg_modmapfmt = arg.substr(12);
    } else if (!cmHasLiteralPrefix(arg, "--") &&
               cmHasLiteralSuffix(arg, ".ddi")) {
      arg_ddis.push_back(arg);
    } else {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_dyndep unknown argument: ", arg));
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --tdi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --lang=");
    return 1;
  }
  if (arg_dd.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --dd=");
    return 1;
  }

  Json::Value tdio;
  Json::Value const& tdi = tdio;
  {
    cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(tdif, tdio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_tdi,
                                    reader.getFormattedErrorMessages()));
      return 1;
    }
  }

  std::string const dir_cur_bld = tdi["dir-cur-bld"].asString();
  std::string const dir_cur_src = tdi["dir-cur-src"].asString();
  std::string const dir_top_bld = tdi["dir-top-bld"].asString();
  std::string const dir_top_src = tdi["dir-top-src"].asString();
  std::string module_dir = tdi["module-dir"].asString();
  if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
    module_dir += '/';
  }
  std::vector<std::string> linked_target_dirs;
  Json::Value const& tdi_linked_target_dirs = tdi["linked-target-dirs"];
  if (tdi_linked_target_dirs.isArray()) {
    for (auto const& tdi_linked_target_dir : tdi_linked_target_dirs) {
      linked_target_dirs.push_back(tdi_linked_target_dir.asString());
    }
  }

  cmGlobalNinjaGenerator::CxxModuleExportInfo export_info;
  export_info.Config = tdi["config"].asString();
  if (export_info.Config.empty()) {
    export_info.Config = "noconfig";
  }
  Json::Value const& tdi_exports = tdi["exports"];
  if (tdi_exports.isArray()) {
    for (auto const& tdi_export : tdi_exports) {
      CxxModuleExport exp;
      exp.Install = tdi_export["install"].asBool();
      exp.Name = tdi_export["export-name"].asString();
      exp.Destination = tdi_export["destination"].asString();
      exp.Prefix = tdi_export["export-prefix"].asString();
      exp.CxxModuleInfoDir = tdi_export["cxx-module-info-dir"].asString();
      exp.Namespace = tdi_export["namespace"].asString();

      export_info.Exports.push_back(exp);
    }
  }
  auto const& bmi_installation = tdi["bmi-installation"];
  if (bmi_installation.isObject()) {
    CxxModuleBmiInstall bmi_install;

    bmi_install.Component = bmi_installation["component"].asString();
    bmi_install.Destination = bmi_installation["destination"].asString();
    bmi_install.ExcludeFromAll = bmi_installation["exclude-from-all"].asBool();
    bmi_install.Optional = bmi_installation["optional"].asBool();
    bmi_install.Permissions = bmi_installation["permissions"].asString();
    bmi_install.MessageLevel = bmi_installation["message-level"].asString();
    bmi_install.ScriptLocation =
      bmi_installation["script-location"].asString();

    export_info.BmiInstallation = bmi_install;
  }
  Json::Value const& tdi_cxx_modules = tdi["cxx-modules"];
  if (tdi_cxx_modules.isObject()) {
    for (auto i = tdi_cxx_modules.begin(); i != tdi_cxx_modules.end(); ++i) {
      CxxModuleFileSet& fsi = export_info.ObjectToFileSet[i.key().asString()];
      auto const& tdi_cxx_module_info = *i;
      fsi.Name = tdi_cxx_module_info["name"].asString();
      fsi.RelativeDirectory =
        tdi_cxx_module_info["relative-directory"].asString();
      fsi.SourcePath = tdi_cxx_module_info["source"].asString();
      fsi.Type = tdi_cxx_module_info["type"].asString();
      fsi.Visibility = cmFileSetVisibilityFromName(
        tdi_cxx_module_info["visibility"].asString(), nullptr);
      auto const& tdi_fs_dest = tdi_cxx_module_info["destination"];
      if (tdi_fs_dest.isString()) {
        fsi.Destination = tdi_fs_dest.asString();
      }
    }
  }

  cmake cm(cmake::RoleInternal, cmState::Unknown);
  cm.SetHomeDirectory(dir_top_src);
  cm.SetHomeOutputDirectory(dir_top_bld);
  auto ggd = cm.CreateGlobalGenerator("Ninja");
  if (!ggd ||
      !cm::static_reference_cast<cmGlobalNinjaGenerator>(ggd).WriteDyndepFile(
        dir_top_src, dir_top_bld, dir_cur_src, dir_cur_bld, arg_dd, arg_ddis,
        module_dir, linked_target_dirs, arg_lang, arg_modmapfmt,
        export_info)) {
    return 1;
  }
  return 0;
}